

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# versionbits_tests.cpp
# Opt level: O0

void __thiscall
versionbits_tests::versionbits_computeblockversion::test_method
          (versionbits_computeblockversion *this)

{
  const_iterator pCVar1;
  Params *pPVar2;
  BlockVersionTest *in_RDI;
  long in_FS_OFFSET;
  uint32_t dep_mask;
  DeploymentPos dep;
  int i;
  uint32_t chain_all_vbits;
  ChainType *chain_type;
  const_iterator __end1;
  const_iterator __begin1;
  initializer_list<ChainType> *__range1;
  unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> chainParams_2;
  unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> chainParams_1;
  unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> chainParams;
  ArgsManager args_1;
  ArgsManager args;
  VersionBitsCache vbcache;
  CChainParams *in_stack_fffffffffffff8d8;
  undefined6 in_stack_fffffffffffff8e0;
  undefined1 in_stack_fffffffffffff8e6;
  undefined1 in_stack_fffffffffffff8e7;
  Params *in_stack_fffffffffffff8e8;
  VersionBitsCache *in_stack_fffffffffffff8f8;
  VersionBitsCache *this_00;
  const_string *in_stack_fffffffffffff900;
  size_t in_stack_fffffffffffff908;
  const_string *in_stack_fffffffffffff910;
  string *strValue;
  Params *in_stack_fffffffffffff918;
  undefined7 in_stack_fffffffffffff920;
  undefined1 in_stack_fffffffffffff927;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff928;
  ChainType chain;
  ArgsManager *in_stack_fffffffffffff930;
  int local_6a4;
  const_iterator local_680;
  allocator<char> local_65a;
  allocator<char> local_659 [15];
  allocator<char> local_64a;
  undefined1 local_649 [33];
  lazy_ostream local_628;
  VersionBitsCache local_90;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  VersionBitsCache::VersionBitsCache(in_stack_fffffffffffff8f8);
  local_680 = std::initializer_list<ChainType>::begin
                        ((initializer_list<ChainType> *)in_stack_fffffffffffff8d8);
  pCVar1 = std::initializer_list<ChainType>::end
                     ((initializer_list<ChainType> *)in_stack_fffffffffffff8e8);
  for (; local_680 != pCVar1; local_680 = local_680 + 1) {
    CreateChainParams(in_stack_fffffffffffff930,
                      (ChainType)((ulong)in_stack_fffffffffffff928 >> 0x20));
    for (local_6a4 = 0; local_6a4 < 2; local_6a4 = local_6a4 + 1) {
      std::unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_>::operator->
                ((unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> *)
                 in_stack_fffffffffffff8d8);
      CChainParams::GetConsensus(in_stack_fffffffffffff8d8);
      VersionBitsCache::Mask
                (in_stack_fffffffffffff8e8,
                 CONCAT11(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e6));
      do {
        in_stack_fffffffffffff930 = boost::unit_test::(anonymous_namespace)::unit_test_log;
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff8e8,
                   (pointer)CONCAT17(in_stack_fffffffffffff8e7,
                                     CONCAT16(in_stack_fffffffffffff8e6,in_stack_fffffffffffff8e0)),
                   (unsigned_long)in_stack_fffffffffffff8d8);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff8d8);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)in_stack_fffffffffffff918,in_stack_fffffffffffff910,
                   in_stack_fffffffffffff908,in_stack_fffffffffffff900);
        boost::test_tools::assertion_result::assertion_result
                  ((assertion_result *)in_stack_fffffffffffff8e8,(bool)in_stack_fffffffffffff8e7);
        in_stack_fffffffffffff928 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             boost::unit_test::lazy_ostream::instance();
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff8e8,
                   (pointer)CONCAT17(in_stack_fffffffffffff8e7,
                                     CONCAT16(in_stack_fffffffffffff8e6,in_stack_fffffffffffff8e0)),
                   (unsigned_long)in_stack_fffffffffffff8d8);
        boost::unit_test::operator<<
                  ((lazy_ostream *)
                   CONCAT17(in_stack_fffffffffffff8e7,
                            CONCAT16(in_stack_fffffffffffff8e6,in_stack_fffffffffffff8e0)),
                   (basic_cstring<const_char> *)in_stack_fffffffffffff8d8);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff8e8,
                   (pointer)CONCAT17(in_stack_fffffffffffff8e7,
                                     CONCAT16(in_stack_fffffffffffff8e6,in_stack_fffffffffffff8e0)),
                   (unsigned_long)in_stack_fffffffffffff8d8);
        in_stack_fffffffffffff8d8 = (CChainParams *)0x0;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&stack0xfffffffffffff9f8,&local_628,
                   (const_string *)(local_649 + 1),0x1b6,CHECK,CHECK_PRED);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                    *)in_stack_fffffffffffff8d8);
        boost::test_tools::assertion_result::~assertion_result
                  ((assertion_result *)in_stack_fffffffffffff8d8);
        in_stack_fffffffffffff927 = boost::test_tools::tt_detail::dummy_cond();
      } while ((bool)in_stack_fffffffffffff927);
      std::unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_>::operator->
                ((unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> *)
                 in_stack_fffffffffffff8d8);
      in_stack_fffffffffffff918 = CChainParams::GetConsensus(in_stack_fffffffffffff8d8);
      BlockVersionTest::check_computeblockversion
                (in_RDI,&local_90,in_stack_fffffffffffff918,(DeploymentPos)local_6a4);
    }
    std::unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_>::~unique_ptr
              ((unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> *)
               in_stack_fffffffffffff8e8);
  }
  ArgsManager::ArgsManager((ArgsManager *)in_stack_fffffffffffff8d8);
  strValue = (string *)local_649;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff928,
             (char *)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
             (allocator<char> *)in_stack_fffffffffffff918);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff928,
             (char *)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
             (allocator<char> *)in_stack_fffffffffffff918);
  ArgsManager::ForceSetArg
            ((ArgsManager *)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
             (string *)in_stack_fffffffffffff918,strValue);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff8d8);
  std::allocator<char>::~allocator(&local_64a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff8d8);
  std::allocator<char>::~allocator((allocator<char> *)local_649);
  CreateChainParams(in_stack_fffffffffffff930,(ChainType)((ulong)in_stack_fffffffffffff928 >> 0x20))
  ;
  std::unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_>::operator->
            ((unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> *)
             in_stack_fffffffffffff8d8);
  pPVar2 = CChainParams::GetConsensus(in_stack_fffffffffffff8d8);
  BlockVersionTest::check_computeblockversion(in_RDI,&local_90,pPVar2,DEPLOYMENT_TESTDUMMY);
  std::unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_>::~unique_ptr
            ((unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> *)
             in_stack_fffffffffffff8e8);
  ArgsManager::~ArgsManager((ArgsManager *)in_stack_fffffffffffff8d8);
  ArgsManager::ArgsManager((ArgsManager *)in_stack_fffffffffffff8d8);
  this_00 = (VersionBitsCache *)local_659;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff928,
             (char *)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
             (allocator<char> *)in_stack_fffffffffffff918);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff928,
             (char *)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
             (allocator<char> *)in_stack_fffffffffffff918);
  chain = (ChainType)((ulong)in_stack_fffffffffffff928 >> 0x20);
  ArgsManager::ForceSetArg
            ((ArgsManager *)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
             (string *)in_stack_fffffffffffff918,strValue);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff8d8);
  std::allocator<char>::~allocator(&local_65a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff8d8);
  std::allocator<char>::~allocator(local_659);
  CreateChainParams(in_stack_fffffffffffff930,chain);
  std::unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_>::operator->
            ((unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> *)
             in_stack_fffffffffffff8d8);
  pPVar2 = CChainParams::GetConsensus(in_stack_fffffffffffff8d8);
  BlockVersionTest::check_computeblockversion(in_RDI,&local_90,pPVar2,DEPLOYMENT_TESTDUMMY);
  std::unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_>::~unique_ptr
            ((unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> *)pPVar2);
  ArgsManager::~ArgsManager((ArgsManager *)in_stack_fffffffffffff8d8);
  VersionBitsCache::~VersionBitsCache(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(versionbits_computeblockversion, BlockVersionTest)
{
    VersionBitsCache vbcache;

    // check that any deployment on any chain can conceivably reach both
    // ACTIVE and FAILED states in roughly the way we expect
    for (const auto& chain_type: {ChainType::MAIN, ChainType::TESTNET, ChainType::TESTNET4, ChainType::SIGNET, ChainType::REGTEST}) {
        const auto chainParams = CreateChainParams(*m_node.args, chain_type);
        uint32_t chain_all_vbits{0};
        for (int i = 0; i < (int)Consensus::MAX_VERSION_BITS_DEPLOYMENTS; ++i) {
            const auto dep = static_cast<Consensus::DeploymentPos>(i);
            // Check that no bits are reused (within the same chain). This is
            // disallowed because the transition to FAILED (on timeout) does
            // not take precedence over STARTED/LOCKED_IN. So all softforks on
            // the same bit might overlap, even when non-overlapping start-end
            // times are picked.
            const uint32_t dep_mask{vbcache.Mask(chainParams->GetConsensus(), dep)};
            BOOST_CHECK(!(chain_all_vbits & dep_mask));
            chain_all_vbits |= dep_mask;
            check_computeblockversion(vbcache, chainParams->GetConsensus(), dep);
        }
    }

    {
        // Use regtest/testdummy to ensure we always exercise some
        // deployment that's not always/never active
        ArgsManager args;
        args.ForceSetArg("-vbparams", "testdummy:1199145601:1230767999"); // January 1, 2008 - December 31, 2008
        const auto chainParams = CreateChainParams(args, ChainType::REGTEST);
        check_computeblockversion(vbcache, chainParams->GetConsensus(), Consensus::DEPLOYMENT_TESTDUMMY);
    }

    {
        // Use regtest/testdummy to ensure we always exercise the
        // min_activation_height test, even if we're not using that in a
        // live deployment
        ArgsManager args;
        args.ForceSetArg("-vbparams", "testdummy:1199145601:1230767999:403200"); // January 1, 2008 - December 31, 2008, min act height 403200
        const auto chainParams = CreateChainParams(args, ChainType::REGTEST);
        check_computeblockversion(vbcache, chainParams->GetConsensus(), Consensus::DEPLOYMENT_TESTDUMMY);
    }
}